

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

cmValue __thiscall
cmTargetInternals::GetFileSetPaths
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,string_view fileSetType)

{
  cmMakefile *this_00;
  int iVar1;
  iterator iVar2;
  _Base_ptr __n;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view separator;
  string local_a0;
  string local_80;
  undefined8 local_60;
  char *local_58;
  _Base_ptr local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  
  __n = (_Base_ptr)fileSetType._M_len;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>_>
          ::find(&(((self->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->FileSets)._M_t
                 ,fileSetName);
  if (iVar2._M_node !=
      (_Base_ptr)
      ((long)&((self->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->FileSets + 8U)) {
    if ((iVar2._M_node[3]._M_parent == __n) &&
       ((__n == (_Base_ptr)0x0 ||
        (iVar1 = bcmp(*(void **)(iVar2._M_node + 3),fileSetType._M_str,(size_t)__n), iVar1 == 0))))
    {
      if (GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
          ::output_abi_cxx11_ == '\0') {
        GetFileSetPaths();
      }
      separator._M_str = ";";
      separator._M_len = 1;
      cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                (&local_80,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(iVar2._M_node + 5),separator);
      std::__cxx11::string::operator=
                ((string *)
                 &GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                  ::output_abi_cxx11_,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p == &local_80.field_2) {
        return (cmValue)&GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                         ::output_abi_cxx11_;
      }
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      return (cmValue)&GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                       ::output_abi_cxx11_;
    }
    this_00 = this->Makefile;
    local_80.field_2._8_8_ = (fileSetName->_M_dataplus)._M_p;
    local_80.field_2._M_allocated_capacity = fileSetName->_M_string_length;
    local_80._M_dataplus._M_p = (pointer)0xa;
    local_80._M_string_length = 0x6a8c2c;
    local_60 = 0x12;
    local_58 = "\" is not of type \"";
    local_40 = 2;
    local_38 = "\".";
    views._M_len = 5;
    views._M_array = (iterator)&local_80;
    local_50 = __n;
    local_48 = fileSetType._M_str;
    cmCatViews_abi_cxx11_(&local_a0,views);
    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  return (cmValue)(string *)0x0;
}

Assistant:

cmValue cmTargetInternals::GetFileSetPaths(cmTarget const* self,
                                           std::string const& fileSetName,
                                           cm::string_view fileSetType) const
{
  auto const* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    return nullptr;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return nullptr;
  }
  static std::string output;
  output = cmJoin(fileSet->GetFileEntries(), ";"_s);
  return cmValue(output);
}